

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

int CompareEdgesByOutput::cmp(void *param_1,void *param_2)

{
  bool bVar1;
  const_reference ppNVar2;
  string *__lhs;
  string *__rhs;
  undefined7 extraout_var;
  Edge *b_local;
  Edge *a_local;
  
  ppNVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                      ((vector<Node_*,_std::allocator<Node_*>_> *)((long)param_1 + 0x28),0);
  __lhs = Node::path_abi_cxx11_(*ppNVar2);
  ppNVar2 = std::vector<Node_*,_std::allocator<Node_*>_>::operator[]
                      ((vector<Node_*,_std::allocator<Node_*>_> *)((long)param_2 + 0x28),0);
  __rhs = Node::path_abi_cxx11_(*ppNVar2);
  bVar1 = std::operator<(__lhs,__rhs);
  return (int)CONCAT71(extraout_var,bVar1);
}

Assistant:

static bool cmp(const Edge* a, const Edge* b) {
    return a->outputs_[0]->path() < b->outputs_[0]->path();
  }